

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 06.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  char eme [8];
  
  setlocale(6,anon_var_dwarf_74d + 0x43);
  builtin_strncpy(eme,"\x1b[1;34m",8);
  std::operator<<((ostream *)&std::cout,eme);
  for (iVar2 = 0; iVar2 != 7; iVar2 = iVar2 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Friedrich Nietzsche");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_721);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_737);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_74d);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Ate entao temos um \'tu deves\'.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Precisamos de uma moral que nos entregue um \'tu sentes?\'");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main()
{
  setlocale(LC_ALL, "");

  char eme[] = {0x1b, '[', '1', ';', '3', '4', 'm', 0};
  cout << eme;

  int i = 6;
  const char n = 'n';

  for (i = 0; i <= 6; i++)
  {
    if (n)
    {
      cout << i << endl;
    }
    cout << "Friedrich Nietzsche" << endl;
    cout << "O medo é o pai da moralidade." << endl;
    cout << "Aquele que abandonou a Deus prende-se em redobrada severidade à crença na moral." << endl;
    cout << "Através da moral conduz-se a humanidade mais facilmente pelo bico!" << endl;
  }
  cout << "Ate entao temos um 'tu deves'." << endl;
  cout << "Precisamos de uma moral que nos entregue um 'tu sentes?'" << endl;
  cout << endl;

  return 0;
}